

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  pointer pcVar1;
  Edition edition;
  FeatureSet *from;
  DebugStringOptions *options;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  FileDescriptor *pFVar5;
  ulong uVar6;
  Nonnull<const_char_*> pcVar7;
  long lVar8;
  Arena *arena;
  size_t in_R9;
  string *eq;
  long lVar9;
  long lVar10;
  iterator iVar11;
  iterator iVar12;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  vector<int,_std::allocator<int>_> path_2;
  vector<int,_std::allocator<int>_> path;
  FileOptions full_options;
  SourceLocationCommentPrinter comment_printer;
  undefined1 local_218 [16];
  pointer local_208;
  DebugStringOptions *local_200;
  string local_1f8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_1d8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [3];
  undefined1 local_100 [32];
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  DebugStringOptions local_90 [2];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_68;
  Descriptor *local_40;
  string *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1d8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = (ctrl_t *)0x0;
  local_1d8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_1d8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_1b8._0_4_ = 0xc;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            ((vector<int,_std::allocator<int>_> *)&local_1d8,(iterator)0x0,(int *)local_1b8);
  pcVar1 = local_100 + 0x10;
  local_100._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
  anon_unknown_24::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_1b8,this,
             (vector<int,_std::allocator<int>_> *)&local_1d8,(string *)local_100,
             debug_string_options);
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_1b8,__return_storage_ptr__);
  edition = this->edition_;
  if ((int)edition < 1000) {
    if (edition == EDITION_PROTO3) {
      local_100._16_6_ = 0x336f00000000;
    }
    else {
      local_100._16_6_ = 0x326f00000000;
    }
    local_100._16_4_ = 0x746f7270;
    uVar2 = local_100._16_8_;
    local_100._8_8_ = 6;
    local_100._16_6_ = (undefined6)uVar2;
    local_100[0x16] = 0;
    local_68.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 6;
    format_00._M_str = (char *)&local_68;
    format_00._M_len = (size_t)"syntax = \"$0\";\n\n";
    local_100._0_8_ = pcVar1;
    local_68.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
         (size_t)pcVar1;
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x10,format_00,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
  }
  else {
    local_100._16_8_ = 0;
    local_100._24_8_ = 0;
    local_100._8_8_ = 0;
    local_100._0_8_ = pcVar1;
    AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
              ((StringifySink *)local_100,edition);
    local_68.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = local_100._8_8_;
    local_68.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
         local_100._0_8_;
    format._M_str = (char *)&local_68;
    format._M_len = (size_t)"edition = \"$0\";\n\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x11,format,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
  }
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_1b8,__return_storage_ptr__);
  local_200 = debug_string_options;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160[1].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish != local_130) {
    operator_delete(local_160[1].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    local_130[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._40_8_ != &local_170) {
    operator_delete((void *)local_1a8._40_8_,local_170._M_allocated_capacity + 1);
  }
  options = local_200;
  if ((undefined1 *)local_1a8._8_8_ != local_1a8 + 0x18) {
    operator_delete((void *)local_1a8._8_8_,
                    CONCAT62(local_1a8._26_6_,CONCAT11(local_1a8[0x19],local_1a8[0x18])) + 1);
  }
  if ((void *)local_1d8.settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .capacity_ != (void *)0x0) {
    operator_delete((void *)local_1d8.settings_.
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_,
                    (long)local_1d8.settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control -
                    local_1d8.settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_);
  }
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
  local_100._24_8_ = &local_d8;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_c8._M_p = (pointer)&local_b8;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90[0].include_comments = options->include_comments;
  local_90[0].elide_group_body = options->elide_group_body;
  local_90[0].elide_oneof_body = options->elide_oneof_body;
  local_88._M_p = (pointer)&local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  if (options->include_comments == true) {
    local_1d8.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    local_1d8.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_1d8.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = (ctrl_t *)0x0;
    bVar3 = GetSourceLocation(this,(vector<int,_std::allocator<int>_> *)&local_1d8,
                              (SourceLocation *)(local_100 + 8));
  }
  else {
    bVar3 = false;
  }
  local_100[0] = bVar3;
  if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&((ThreadSafeArena *)local_1a8._0_8_)->tag_and_id_ + 1));
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_100,__return_storage_ptr__);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
  ::raw_hash_set<int*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
              *)&local_1d8,this->public_dependencies_,
             this->public_dependencies_ + this->public_dependency_count_,0,(hasher *)local_1b8,
             (key_equal *)&local_68,(allocator_type *)&local_1f8);
  eq = &local_1f8;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
  ::raw_hash_set<int*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
              *)&local_68,this->weak_dependencies_,
             this->weak_dependencies_ + this->weak_dependency_count_,0,(hasher *)local_1b8,
             (key_equal *)eq,(allocator_type *)local_218);
  local_1f8._M_dataplus._M_p = (pointer)((ulong)local_1f8._M_dataplus._M_p._4_4_ << 0x20);
  if (0 < this->dependency_count_) {
    do {
      iVar11 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
               ::find<int>(&local_1d8,(key_arg<int> *)&local_1f8);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::AssertNotDebugCapacity(&local_1d8);
      if (iVar11.ctrl_ == (ctrl_t *)0x0) {
        iVar11 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                 ::find<int>(&local_68,(key_arg<int> *)&local_1f8);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::AssertNotDebugCapacity(&local_68);
        if (iVar11.ctrl_ == (ctrl_t *)0x0) {
          pFVar5 = dependency(this,(int)local_1f8._M_dataplus._M_p);
          local_1b8._8_8_ = (pFVar5->name_->_M_dataplus)._M_p;
          local_1b8._0_8_ = pFVar5->name_->_M_string_length;
          format_03._M_str = local_1b8;
          format_03._M_len = (size_t)"import \"$0\";\n";
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0xd,
                     format_03,(Nullable<const_absl::string_view_*>)0x1,(size_t)eq);
        }
        else {
          pFVar5 = dependency(this,(int)local_1f8._M_dataplus._M_p);
          local_1b8._8_8_ = (pFVar5->name_->_M_dataplus)._M_p;
          local_1b8._0_8_ = pFVar5->name_->_M_string_length;
          format_02._M_str = local_1b8;
          format_02._M_len = (size_t)"import weak \"$0\";\n";
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x12,
                     format_02,(Nullable<const_absl::string_view_*>)0x1,(size_t)eq);
        }
      }
      else {
        pFVar5 = dependency(this,(int)local_1f8._M_dataplus._M_p);
        local_1b8._8_8_ = (pFVar5->name_->_M_dataplus)._M_p;
        local_1b8._0_8_ = pFVar5->name_->_M_string_length;
        format_01._M_str = local_1b8;
        format_01._M_len = (size_t)"import public \"$0\";\n";
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x14,
                   format_01,(Nullable<const_absl::string_view_*>)0x1,(size_t)eq);
      }
      iVar4 = (int)local_1f8._M_dataplus._M_p + 1;
      local_1f8._M_dataplus._M_p._0_4_ = iVar4;
    } while (iVar4 < this->dependency_count_);
  }
  if (this->package_->_M_string_length != 0) {
    local_218._0_8_ = (key_arg<const_google::protobuf::Descriptor_*>)0x0;
    local_218._8_8_ = (slot_type *)0x0;
    local_208 = (pointer)0x0;
    local_1b8._0_4_ = 2;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_218,(iterator)0x0,(int *)local_1b8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
    anon_unknown_24::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_1b8,this,
               (vector<int,_std::allocator<int>_> *)local_218,&local_1f8,options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_1b8,__return_storage_ptr__);
    local_1f8._M_string_length = (size_type)(this->package_->_M_dataplus)._M_p;
    local_1f8._M_dataplus._M_p = (pointer)this->package_->_M_string_length;
    format_04._M_str = (char *)&local_1f8;
    format_04._M_len = (size_t)"package $0;\n\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0xd,format_04,
               (Nullable<const_absl::string_view_*>)0x1,(size_t)eq);
    anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_1b8,__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160[1].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish != local_130) {
      operator_delete(local_160[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      local_130[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._40_8_ != &local_170) {
      operator_delete((void *)local_1a8._40_8_,local_170._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._8_8_ != local_1a8 + 0x18) {
      operator_delete((void *)local_1a8._8_8_,
                      CONCAT62(local_1a8._26_6_,CONCAT11(local_1a8[0x19],local_1a8[0x18])) + 1);
    }
    if ((key_arg<const_google::protobuf::Descriptor_*>)local_218._0_8_ !=
        (key_arg<const_google::protobuf::Descriptor_*>)0x0) {
      operator_delete((void *)local_218._0_8_,(long)local_208 - local_218._0_8_);
    }
  }
  FileOptions::FileOptions((FileOptions *)local_1b8,(Arena *)0x0,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    local_1a8[0x19] = local_1a8[0x19] | 4;
    if ((FeatureSet *)local_130[1]._0_8_ == (FeatureSet *)0x0) {
      arena = (Arena *)local_1b8._8_8_;
      if ((local_1b8._8_8_ & 1) != 0) {
        arena = *(Arena **)(local_1b8._8_8_ & 0xfffffffffffffffe);
      }
      local_130[1]._0_8_ = Arena::DefaultConstruct<google::protobuf::FeatureSet>(arena);
    }
    FeatureSet::CopyFrom((FeatureSet *)local_130[1]._0_8_,from);
  }
  bVar3 = anon_unknown_24::FormatLineOptions
                    (0,(Message *)local_1b8,this->pool_,__return_storage_ptr__);
  if (bVar3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (0 < this->enum_type_count_) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      EnumDescriptor::DebugString
                ((EnumDescriptor *)(&this->enum_types_->super_SymbolBase + lVar8),0,
                 __return_storage_ptr__,local_200);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar9 < this->enum_type_count_);
  }
  local_1f8._M_dataplus._M_p = (pointer)0x1;
  local_1f8._M_string_length = 0;
  iVar4 = this->extension_count_;
  if (0 < iVar4) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (((int)this->edition_ < 1000) && ((&this->extensions_->type_)[lVar8] == '\n')) {
        local_40 = FieldDescriptor::message_type
                             ((FieldDescriptor *)(&this->extensions_->super_SymbolBase + lVar8));
        local_38 = &local_1f8;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                    *)local_218,&local_38,&local_40,&local_40);
        iVar4 = this->extension_count_;
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar9 < iVar4);
  }
  if (0 < this->message_type_count_) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      local_218._0_8_ = &this->message_types_->super_SymbolBase + lVar8;
      iVar12 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
               ::find<google::protobuf::Descriptor_const*>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                           *)&local_1f8,(key_arg<const_google::protobuf::Descriptor_*> *)local_218);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)&local_1f8);
      if (iVar12.ctrl_ == (ctrl_t *)0x0) {
        if (this->message_type_count_ <= lVar9) {
          pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (lVar9,(long)this->message_type_count_,"index < message_type_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xae7,pcVar7);
          goto LAB_00213013;
        }
        Descriptor::DebugString
                  ((Descriptor *)(&this->message_types_->super_SymbolBase + lVar8),0,
                   __return_storage_ptr__,local_200,true);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0xa0;
    } while (lVar9 < this->message_type_count_);
  }
  if (0 < this->service_count_) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      ServiceDescriptor::DebugString
                ((ServiceDescriptor *)(&this->services_->super_SymbolBase + lVar8),
                 __return_storage_ptr__,local_200);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x40;
    } while (lVar9 < this->service_count_);
  }
  uVar6 = (ulong)(uint)this->extension_count_;
  if (0 < this->extension_count_) {
    lVar10 = 0;
    lVar9 = 0;
    lVar8 = 0;
    do {
      iVar4 = (int)uVar6;
      if (*(long *)((long)&this->extensions_->containing_type_ + lVar10) != lVar8) {
        if (lVar9 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          iVar4 = this->extension_count_;
        }
        if (iVar4 <= lVar9) {
          pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (lVar9,(long)iVar4,"index < extension_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xaec,pcVar7);
LAB_00213013:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_218);
        }
        lVar8 = *(long *)((long)&this->extensions_->containing_type_ + lVar10);
        local_218._0_8_ = ZEXT28(*(ushort *)(*(long *)(lVar8 + 0x10) + 2));
        local_218._8_8_ = ~local_218._0_8_ + *(long *)(lVar8 + 0x10);
        format_05._M_str = local_218;
        format_05._M_len = (size_t)"extend .$0 {\n";
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0xd,
                   format_05,(Nullable<const_absl::string_view_*>)0x1,(size_t)eq);
        iVar4 = this->extension_count_;
      }
      if (iVar4 <= lVar9) {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar9,(long)iVar4,"index < extension_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xaec,pcVar7);
        goto LAB_00213013;
      }
      FieldDescriptor::DebugString
                ((FieldDescriptor *)(&this->extensions_->super_SymbolBase + lVar10),1,
                 __return_storage_ptr__,local_200);
      lVar9 = lVar9 + 1;
      uVar6 = (ulong)this->extension_count_;
      lVar10 = lVar10 + 0x58;
    } while (lVar9 < (long)uVar6);
    if (0 < this->extension_count_) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_100,__return_storage_ptr__);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)&local_1f8);
  FileOptions::~FileOptions((FileOptions *)local_1b8);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::destructor_impl(&local_68);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::destructor_impl(&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._24_8_ != &local_d8) {
    operator_delete((void *)local_100._24_8_,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(this, path, "",
                                                debug_string_options);
    syntax_comment.AddPreComment(&contents);
    if (IsLegacyEdition(edition())) {
      absl::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                                GetLegacySyntaxName(edition()));
    } else {
      absl::SubstituteAndAppend(&contents, "edition = \"$0\";\n\n", edition());
    }
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  absl::flat_hash_set<int> public_dependencies(
      public_dependencies_, public_dependencies_ + public_dependency_count_);
  absl::flat_hash_set<int> weak_dependencies(
      weak_dependencies_, weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.contains(i)) {
      absl::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                dependency(i)->name());
    } else if (weak_dependencies.contains(i)) {
      absl::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                dependency(i)->name());
    } else {
      absl::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(this, path, "",
                                                 debug_string_options);
    package_comment.AddPreComment(&contents);
    absl::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  FileOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  if (FormatLineOptions(0, full_options, pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  absl::flat_hash_set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (IsGroupSyntax(edition(), extension(i))) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (!groups.contains(message_type(i))) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      absl::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                containing_type->full_name());
    }
    extension(i)->DebugString(1, &contents, debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}